

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::assignAdditionalFacet
          (DecimalDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  bool bVar1;
  uint uVar2;
  InvalidDatatypeFacetException *pIVar3;
  NumberFormatException *anon_var_0_1;
  int val_1;
  NumberFormatException *anon_var_0;
  int val;
  MemoryManager *manager_local;
  XMLCh *value_local;
  XMLCh *key_local;
  DecimalDatatypeValidator *this_local;
  
  bVar1 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_TOTALDIGITS);
  if (bVar1) {
    uVar2 = XMLString::parseInt(value,manager);
    if ((int)uVar2 < 1) {
      pIVar3 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x7e,FACET_PosInt_TotalDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager)
      ;
      __cxa_throw(pIVar3,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    setTotalDigits(this,uVar2);
    DatatypeValidator::setFacetsDefined((DatatypeValidator *)this,0x200);
  }
  else {
    bVar1 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS);
    if (!bVar1) {
      pIVar3 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x9b,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar3,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    uVar2 = XMLString::parseInt(value,manager);
    if ((int)uVar2 < 0) {
      pIVar3 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x91,FACET_NonNeg_FractDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager)
      ;
      __cxa_throw(pIVar3,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    setFractionDigits(this,uVar2);
    DatatypeValidator::setFacetsDefined((DatatypeValidator *)this,0x400);
  }
  return;
}

Assistant:

void DecimalDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                   , const XMLCh* const value
                                                   , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_TotalDigit, value, manager);
        }

        // check 4.3.11.c0 must: totalDigits > 0
        if ( val <= 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_PosInt_TotalDigit, value, manager);

        setTotalDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_TOTALDIGITS);
    }
    else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_FractDigit, value, manager);
        }

        // check 4.3.12.c0 must: fractionDigits > 0
        if ( val < 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_NonNeg_FractDigit, value, manager);

        setFractionDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_FRACTIONDIGITS);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}